

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O0

pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
* __thiscall
CppCNN::preprocess_data
          (pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           *__return_storage_ptr__,CppCNN *this,ImageVolume *examples,VectorXd *labels)

{
  ostream *this_00;
  undefined1 local_58 [8];
  ImageVolume examples_norm;
  MatrixXd labels_mat;
  VectorXd *labels_local;
  ImageVolume *examples_local;
  CppCNN *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"preprocess_data");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  build_labels_matrix((MatrixXd *)
                      &examples_norm.
                       super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this,labels);
  normalize_examples((ImageVolume *)local_58,this,examples);
  std::
  make_pair<std::vector<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,std::allocator<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            (__return_storage_ptr__,
             (vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)local_58,
             (Matrix<double,__1,__1,_0,__1,__1> *)
             &examples_norm.
              super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             *)local_58);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &examples_norm.
              super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

pair<ImageVolume, MatrixXd> CppCNN::preprocess_data(const ImageVolume& examples, const VectorXd& labels) {
	cout << __FUNCTION__ << endl;

	auto labels_mat = build_labels_matrix(labels);
	auto examples_norm = normalize_examples(examples);

	return make_pair(examples_norm, labels_mat);
}